

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O2

bool __thiscall GF2::MM<137UL>::IsDivisibleBy(MM<137UL> *this,MM<137UL> *mRight)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 3) break;
    uVar1 = uVar2 + 1;
  } while (((mRight->super_WW<137UL>)._words[uVar2] & ~(this->super_WW<137UL>)._words[uVar2]) == 0);
  return 2 < uVar2;
}

Assistant:

bool IsDivisibleBy(const MM& mRight) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if (mRight.GetWord(pos) & ~_words[pos])
				return false;
		return true;
	}